

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

void idx2::ComputeTransformDetails(transform_info *Td,v3i *Dims3,int NPasses,u64 TformOrder)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  grid *pgVar5;
  stack_array<idx2::grid,_32> *psVar6;
  stack_array<int,_32> *psVar7;
  ulong uVar8;
  int iVar9;
  undefined1 local_2c0 [272];
  uint local_1b0;
  int local_1ac;
  int D;
  int StackSize;
  grid G;
  v3i S3;
  v3i R3;
  v3i D3;
  u64 PrevOrder;
  undefined8 uStack_158;
  int Pass;
  u64 TformOrder_local;
  int NPasses_local;
  v3i *Dims3_local;
  transform_info *Td_local;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  v3i *local_118;
  int *local_110;
  undefined4 local_104;
  undefined4 *local_100;
  undefined1 *local_f8;
  int *local_f0;
  undefined1 *local_e8;
  int *local_e0;
  undefined1 *local_d8;
  int *local_d0;
  int local_c4;
  stack_array<idx2::grid,_32> *local_c0;
  int local_b4;
  stack_array<int,_32> *local_b0;
  uint local_a4;
  undefined1 *local_a0;
  uint local_94;
  undefined1 *local_90;
  uint local_84;
  undefined1 *local_80;
  uint local_74;
  undefined1 *local_70;
  uint local_64;
  undefined1 *local_60;
  uint local_54;
  undefined1 *local_50;
  ulong local_48;
  v3i *local_40;
  int *local_38;
  v3i *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 *local_10;
  
  PrevOrder._4_4_ = 0;
  uVar4 = *(undefined8 *)&Dims3->field_0;
  uVar3 = *(uint *)((long)&Dims3->field_0 + 8);
  G.Strd._4_4_ = 1;
  S3.field_0.field_0.X = 1;
  G.super_extent.From =
       (long)(int)((Dims3->field_0).field_0.X & 0x1fffff) +
       (long)(int)((Dims3->field_0).field_0.Y & 0x1fffff) * 0x200000 +
       ((long)(int)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a);
  local_104 = 1;
  local_124 = 1;
  local_120 = 1;
  local_11c = 1;
  G.super_extent.Dims = 0x40000200001;
  local_1ac = 0;
  D3.field_0.field_4.YZ.field_0 = (v2<int>)TformOrder;
  uStack_158 = TformOrder;
  while( true ) {
    while( true ) {
      S3.field_0._4_8_ = uVar4;
      R3.field_0.field_0.X = uVar3;
      R3.field_0._4_8_ = uVar4;
      local_118 = Dims3;
      local_110 = &D;
      local_100 = &local_124;
      local_40 = Dims3;
      local_38 = &D;
      local_30 = Dims3;
      local_10 = &local_124;
      if (NPasses <= PrevOrder._4_4_) {
        Td->TformOrder = uStack_158;
        Td->StackSize = local_1ac;
        GetCdf53NormsFast<16>();
        memcpy(Td,local_2c0,0x110);
        Td->NPasses = NPasses;
        return;
      }
      local_1b0 = (uint)uStack_158 & 3;
      uStack_158 = (ulong)uStack_158 >> 2;
      R3.field_0.field_0.Y = (int)uVar4;
      R3.field_0.field_0.Z = (int)((ulong)uVar4 >> 0x20);
      if (local_1b0 != 3) break;
      if ((anon_union_8_4_6ba14846_for_v2<int>_1)uStack_158 ==
          (anon_union_8_4_6ba14846_for_v2<int>_1)0x3) {
        uStack_158 = D3.field_0.field_4.YZ.field_0;
      }
      D3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)uStack_158;
      local_f0 = &D;
      local_f8 = (undefined1 *)((long)&G.Strd + 4);
      G.super_extent.Dims =
           (long)(int)(G.Strd._4_4_ & 0x1fffff) + 0x200000 +
           ((long)(int)(S3.field_0.field_0.X & 0x1fffff) << 0x2a);
      local_d0 = &D;
      local_d8 = (undefined1 *)((long)&R3.field_0 + 4);
      G.super_extent.From =
           (long)(int)(R3.field_0.field_0.Y & 0x1fffff) +
           (long)(int)(R3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
           ((long)(int)(uVar3 & 0x1fffff) << 0x2a);
      PrevOrder._4_4_ = PrevOrder._4_4_ + 1;
      uStack_158 = D3.field_0.field_4.YZ.field_0;
      local_28 = local_d8;
      local_18 = local_f8;
    }
    psVar6 = &Td->StackGrids;
    local_c4 = local_1ac;
    local_c0 = psVar6;
    if (0x1f < local_1ac) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                   );
    }
    pgVar5 = psVar6->Arr + local_1ac;
    (pgVar5->super_extent).From = 0;
    (pgVar5->super_extent).Dims = G.super_extent.From;
    pgVar5->Strd = G.super_extent.Dims;
    psVar7 = &Td->StackAxes;
    iVar9 = local_1ac + 1;
    local_b4 = local_1ac;
    local_b0 = psVar7;
    if (0x1f < local_1ac) {
      local_1ac = iVar9;
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]")
      ;
    }
    psVar7->Arr[local_1ac] = local_1b0;
    puVar1 = (undefined1 *)((long)&R3.field_0 + 4);
    local_54 = local_1b0;
    local_50 = puVar1;
    if (2 < local_1b0) {
      local_1ac = iVar9;
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    puVar2 = (undefined1 *)((long)&R3.field_0 + 4);
    local_64 = local_1b0;
    local_60 = puVar2;
    if (2 < local_1b0) {
      local_1ac = iVar9;
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    uVar8 = (ulong)*(int *)(puVar2 + (long)(int)local_1b0 * 4);
    puVar2 = (undefined1 *)((long)&S3.field_0 + 4);
    local_74 = local_1b0;
    local_70 = puVar2;
    local_48 = uVar8;
    if (2 < local_1b0) {
      local_1ac = iVar9;
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(uint *)(puVar2 + (long)(int)local_1b0 * 4) =
         *(int *)(puVar1 + (long)(int)local_1b0 * 4) + (uint)((uVar8 & 1) == 0);
    local_e0 = &D;
    local_e8 = (undefined1 *)((long)&S3.field_0 + 4);
    G.super_extent.From =
         (long)(int)(R3.field_0.field_0.Y & 0x1fffff) +
         (long)(int)(R3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
         ((long)(int)(uVar3 & 0x1fffff) << 0x2a);
    local_80 = (undefined1 *)((long)&S3.field_0 + 4);
    local_84 = local_1b0;
    local_20 = local_e8;
    if (2 < local_1b0) {
      local_1ac = iVar9;
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_90 = (undefined1 *)((long)&R3.field_0 + 4);
    local_94 = local_1b0;
    if (2 < local_1b0) break;
    *(int *)(local_90 + (long)(int)local_1b0 * 4) =
         *(int *)(local_80 + (long)(int)local_1b0 * 4) + 1 >> 1;
    puVar1 = (undefined1 *)((long)&G.Strd + 4);
    local_a4 = local_1b0;
    local_a0 = puVar1;
    if (2 < local_1b0) {
      local_1ac = iVar9;
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)(puVar1 + (long)(int)local_1b0 * 4) = *(int *)(puVar1 + (long)(int)local_1b0 * 4) << 1;
    local_1ac = iVar9;
  }
  local_1ac = iVar9;
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

void
ComputeTransformDetails(transform_info* Td, const v3i& Dims3, int NPasses, u64 TformOrder)
{
  int Pass = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  int StackSize = 0;
  while (Pass < NPasses)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Pass;
    }
    else
    {
      Td->StackGrids[StackSize] = G;
      Td->StackAxes[StackSize++] = D;
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }
  Td->TformOrder = TformOrder;
  Td->StackSize = StackSize;
  Td->BasisNorms = GetCdf53NormsFast<16>();
  Td->NPasses = NPasses;
}